

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

ssize_t __thiscall
kj::ReadableDirectory::readlink(ReadableDirectory *this,char *__path,char *__buf,size_t __len)

{
  char (*params) [2];
  PathPtr path_local;
  Fault f;
  _func_int **local_48;
  _func_int **pp_Stack_40;
  _func_int **local_38;
  
  path_local.parts.ptr = (String *)__buf;
  path_local.parts.size_ = __len;
  (**(code **)(*(long *)__path + 0x60))(&f);
  if ((char)f.exception == '\0') {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[14],kj::PathPtr&>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x239,FAILED,(char *)0x0,"\"not a symlink\", path",(char (*) [14])"not a symlink",
               &path_local);
    _::Debug::Fault::~Fault(&f);
    str<char_const(&)[2]>((String *)this,(kj *)0x3af86a,params);
  }
  else {
    (this->super_FsNode)._vptr_FsNode = local_48;
    this[1].super_FsNode._vptr_FsNode = pp_Stack_40;
    this[2].super_FsNode._vptr_FsNode = local_38;
  }
  return (ssize_t)this;
}

Assistant:

String ReadableDirectory::readlink(PathPtr path) const {
  KJ_IF_MAYBE(p, tryReadlink(path)) {
    return kj::mv(*p);
  } else {
    KJ_FAIL_REQUIRE("not a symlink", path) { break; }